

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O2

FT_Error tt_size_run_prep(TT_Size size,FT_Bool pedantic)

{
  TT_Face face;
  TT_ExecContext exec;
  FT_ULong FVar1;
  FT_Byte *pFVar2;
  FT_UShort FVar3;
  FT_UShort FVar4;
  FT_F2Dot14 FVar5;
  FT_Error FVar6;
  long lVar7;
  TT_GraphicsState *pTVar8;
  TT_GraphicsState *pTVar9;
  byte bVar10;
  
  bVar10 = 0;
  face = (TT_Face)(size->root).face;
  exec = size->context;
  FVar6 = TT_Load_Context(exec,face,size);
  if (FVar6 == 0) {
    exec->callTop = 0;
    exec->top = 0;
    exec->instruction_trap = '\0';
    exec->pedantic_hinting = pedantic;
    FVar1 = face->cvt_program_size;
    pFVar2 = face->cvt_program;
    exec->codeRangeTable[1].base = pFVar2;
    exec->codeRangeTable[1].size = FVar1;
    exec->codeRangeTable[2].base = (FT_Byte *)0x0;
    exec->codeRangeTable[2].size = 0;
    if (face->cvt_program_size == 0) {
      FVar6 = 0;
    }
    else {
      exec->code = pFVar2;
      exec->codeSize = FVar1;
      exec->IP = 0;
      exec->curRange = 2;
      FVar6 = (*face->interpreter)(exec);
    }
    size->cvt_ready = FVar6;
    *(undefined8 *)&(exec->GS).dualVector.y = 0x4000000040000000;
    (exec->GS).freeVector.y = 0;
    (exec->GS).rp0 = 0;
    (exec->GS).rp1 = 0;
    (exec->GS).rp2 = 0;
    (exec->GS).dualVector.x = 0x4000;
    (exec->GS).gep0 = 1;
    (exec->GS).gep1 = 1;
    (exec->GS).gep2 = 1;
    (exec->GS).loop = 1;
    pTVar8 = &exec->GS;
    pTVar9 = &size->GS;
    for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
      FVar3 = pTVar8->rp1;
      FVar4 = pTVar8->rp2;
      FVar5 = (pTVar8->dualVector).x;
      pTVar9->rp0 = pTVar8->rp0;
      pTVar9->rp1 = FVar3;
      pTVar9->rp2 = FVar4;
      (pTVar9->dualVector).x = FVar5;
      pTVar8 = (TT_GraphicsState *)((long)pTVar8 + (ulong)bVar10 * -0x10 + 8);
      pTVar9 = (TT_GraphicsState *)((long)pTVar9 + (ulong)bVar10 * -0x10 + 8);
    }
    TT_Save_Context(exec,size);
  }
  return FVar6;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_run_prep( TT_Size  size,
                    FT_Bool  pedantic )
  {
    TT_Face         face = (TT_Face)size->root.face;
    TT_ExecContext  exec;
    FT_Error        error;


    exec = size->context;

    error = TT_Load_Context( exec, face, size );
    if ( error )
      return error;

    exec->callTop = 0;
    exec->top     = 0;

    exec->instruction_trap = FALSE;

    exec->pedantic_hinting = pedantic;

    TT_Set_CodeRange( exec,
                      tt_coderange_cvt,
                      face->cvt_program,
                      (FT_Long)face->cvt_program_size );

    TT_Clear_CodeRange( exec, tt_coderange_glyph );

    if ( face->cvt_program_size > 0 )
    {
      TT_Goto_CodeRange( exec, tt_coderange_cvt, 0 );

      FT_TRACE4(( "Executing `prep' table.\n" ));
      error = face->interpreter( exec );
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( error )
        FT_TRACE4(( "  interpretation failed with error code 0x%x\n",
                    error ));
#endif
    }
    else
      error = FT_Err_Ok;

    size->cvt_ready = error;

    /* UNDOCUMENTED!  The MS rasterizer doesn't allow the following */
    /* graphics state variables to be modified by the CVT program.  */

    exec->GS.dualVector.x = 0x4000;
    exec->GS.dualVector.y = 0;
    exec->GS.projVector.x = 0x4000;
    exec->GS.projVector.y = 0x0;
    exec->GS.freeVector.x = 0x4000;
    exec->GS.freeVector.y = 0x0;

    exec->GS.rp0 = 0;
    exec->GS.rp1 = 0;
    exec->GS.rp2 = 0;

    exec->GS.gep0 = 1;
    exec->GS.gep1 = 1;
    exec->GS.gep2 = 1;

    exec->GS.loop = 1;

    /* save as default graphics state */
    size->GS = exec->GS;

    TT_Save_Context( exec, size );

    return error;
  }